

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O1

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  size_t *psVar1;
  Byte BVar2;
  byte bVar3;
  size_t sVar4;
  UInt64 UVar5;
  ILookInStream *pIVar6;
  SRes SVar7;
  UInt32 UVar8;
  Bool_conflict BVar9;
  int iVar10;
  UInt64 UVar11;
  ulong uVar12;
  CPpmd7_Context *outBuffer_00;
  Byte *pBVar13;
  uint uVar14;
  UInt32 UVar15;
  UInt32 size;
  ulong uVar16;
  _func_UInt32_void_ptr_UInt32 *p_Var17;
  _func_UInt32_void_ptr_UInt32 *p_Var18;
  long lVar19;
  bool bVar20;
  ulong uVar21;
  UInt64 inSize;
  _func_UInt32_void_ptr_UInt32 *inSize_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  SizeT inProcessed;
  void *inBuf;
  Byte *tempBuf [3];
  CSzFolder folder;
  SizeT tempSizes [3];
  CSzData sd;
  CPpmd7 ppmd;
  _func_UInt32_void_ptr_UInt32 *local_4cb8;
  ELzmaStatus local_4cac;
  _func_UInt32_void_ptr_UInt32 *local_4ca8;
  UInt32 local_4c9c;
  Byte *local_4c98;
  ILookInStream *local_4c90;
  _func_UInt32_void_ptr_UInt32 *local_4c88;
  CSzAr *local_4c80;
  CPpmd7_Context *local_4c78;
  UInt64 *local_4c70;
  UInt64 local_4c68;
  ulong local_4c60;
  IByteIn local_4c58;
  undefined1 local_4c50 [16];
  undefined1 local_4c40 [16];
  undefined8 local_4c30;
  ILookInStream *local_4c28;
  CPpmd7z_RangeDec local_4c20;
  undefined1 local_4bf8 [16];
  Byte *local_4be8;
  CSzFolder local_4be0;
  undefined1 local_4b68 [16];
  UInt64 local_4b58;
  Byte *local_4b50;
  ulong local_4b48;
  UInt64 *local_4b40;
  CSzData local_4b38;
  undefined1 local_4b28 [16];
  undefined1 local_4b18 [16];
  _func_UInt32_void_ptr_UInt32 *local_4b08;
  Byte *local_4b00;
  _func_UInt32_void_ptr_UInt32 *local_4af8;
  _func_UInt32_void_ptr_UInt32 *local_4af0;
  Byte *local_4ae8 [2];
  UInt32 local_4ad8;
  UInt32 local_4ac8;
  
  uVar21 = (ulong)folderIndex;
  sVar4 = p->FoCodersOffsets[uVar21];
  pBVar13 = p->CodersData;
  local_4b38.Size = p->FoCodersOffsets[folderIndex + 1] - sVar4;
  local_4b38.Data = pBVar13 + sVar4;
  SVar7 = SzGetNextFolderItem(&local_4be0,&local_4b38);
  if (SVar7 != 0) {
    return SVar7;
  }
  if (local_4b38.Size != 0) {
    return 0xb;
  }
  if (local_4be0.UnpackStream != p->FoToMainUnpackSizeIndex[uVar21]) {
    return 0xb;
  }
  local_4c98 = pBVar13 + sVar4;
  local_4c90 = inStream;
  local_4c80 = p;
  local_4c68 = startPos;
  local_4c60 = (ulong)folderIndex;
  UVar11 = SzAr_GetFolderUnpackSize(p,folderIndex);
  if (UVar11 != outSize) {
    return 0xb;
  }
  local_4bf8 = (undefined1  [16])0x0;
  local_4be8 = (Byte *)0x0;
  local_4b40 = p->CoderUnpackSizes + p->FoToCoderUnpackSizes[uVar21];
  local_4c70 = p->PackPositions + p->FoStartPackStreamIndex[uVar21];
  local_4b58 = 0;
  local_4b68 = (undefined1  [16])0x0;
  uVar12 = (ulong)local_4be0.NumCoders;
  UVar15 = 4;
  if ((3 < local_4be0.NumCoders - 1) || (local_4be0.Coders[0].NumStreams != '\x01'))
  goto LAB_0070aef1;
  if ((int)local_4be0.Coders[0].MethodID < 0x30101) {
    if ((local_4be0.Coders[0].MethodID != 0) && (local_4be0.Coders[0].MethodID != 0x21))
    goto LAB_0070aef1;
  }
  else if ((local_4be0.Coders[0].MethodID != 0x30401) && (local_4be0.Coders[0].MethodID != 0x30101))
  goto LAB_0070aef1;
  if (local_4be0.NumCoders == 4) {
    if (local_4be0.Coders[1].NumStreams != '\x01') goto LAB_0070aef1;
    if ((int)local_4be0.Coders[1].MethodID < 0x30101) {
      if ((local_4be0.Coders[1].MethodID != 0) && (local_4be0.Coders[1].MethodID != 0x21))
      goto LAB_0070aef1;
    }
    else if ((local_4be0.Coders[1].MethodID != 0x30401) &&
            (local_4be0.Coders[1].MethodID != 0x30101)) goto LAB_0070aef1;
    if (local_4be0.Coders[2].NumStreams != '\x01') goto LAB_0070aef1;
    if ((int)local_4be0.Coders[2].MethodID < 0x30101) {
      if ((local_4be0.Coders[2].MethodID != 0) && (local_4be0.Coders[2].MethodID != 0x21))
      goto LAB_0070aef1;
    }
    else if ((local_4be0.Coders[2].MethodID != 0x30401) &&
            (local_4be0.Coders[2].MethodID != 0x30101)) goto LAB_0070aef1;
    if (local_4be0.Coders[3].MethodID != 0x303011b) goto LAB_0070aef1;
    auVar23._0_4_ = -(uint)(local_4be0.NumBonds == 3);
    auVar23._4_4_ = -(uint)(local_4be0.Bonds[0].InIndex == 5);
    auVar23._8_4_ = -(uint)(local_4be0.Bonds[0].OutIndex == 0);
    auVar23._12_4_ = -(uint)(local_4be0.Bonds[1].InIndex == 4);
    auVar22._0_4_ = -(uint)(local_4be0.PackStreams[0] == 2);
    auVar22._4_4_ = -(uint)(local_4be0.PackStreams[1] == 6);
    auVar22._8_4_ = -(uint)(local_4be0.PackStreams[2] == 1);
    auVar22._12_4_ = -(uint)(local_4be0.PackStreams[3] == 0);
    auVar22 = packssdw(auVar22,auVar23);
    auVar22 = packsswb(auVar22,auVar22);
    if (((((byte)(SUB161(auVar22 >> 7,0) & 1 | (SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar22 >> 0x17,0) & 1) << 2 | (SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar22 >> 0x27,0) & 1) << 4 | (SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar22 >> 0x37,0) & 1) << 6 | SUB161(auVar22 >> 0x3f,0) << 7) != 0xff) ||
         (local_4be0.NumPackStreams != 4)) || (local_4be0.Bonds[1].OutIndex != 1)) ||
       ((local_4be0.Bonds[2].InIndex != 3 || (local_4be0.Coders[3].NumStreams != '\x04'))))
    goto LAB_0070aef1;
    local_4be0.NumBonds = local_4be0.Bonds[2].OutIndex - 2;
  }
  else {
    if (local_4be0.NumCoders == 2) {
      if (((local_4be0.Coders[1].NumStreams == '\x01') && (local_4be0.NumPackStreams == 1)) &&
         ((local_4be0.PackStreams[0] == 0 &&
          (((local_4be0.NumBonds == 1 && (local_4be0.Bonds[0].InIndex == 1)) &&
           (local_4be0.Bonds[0].OutIndex == 0)))))) {
        if ((int)local_4be0.Coders[1].MethodID < 0x3030401) {
          if (((local_4be0.Coders[1].MethodID != 3) && (local_4be0.Coders[1].MethodID != 0x3030103))
             && (local_4be0.Coders[1].MethodID != 0x3030205)) goto LAB_0070aef1;
        }
        else if ((int)local_4be0.Coders[1].MethodID < 0x3030701) {
          if ((local_4be0.Coders[1].MethodID != 0x3030401) &&
             (local_4be0.Coders[1].MethodID != 0x3030501)) goto LAB_0070aef1;
        }
        else if ((local_4be0.Coders[1].MethodID != 0x3030805) &&
                (local_4be0.Coders[1].MethodID != 0x3030701)) goto LAB_0070aef1;
        UVar15 = 0;
      }
      goto LAB_0070aef1;
    }
    if (((local_4be0.NumCoders != 1) || (local_4be0.NumPackStreams != 1)) ||
       (local_4be0.PackStreams[0] != 0)) goto LAB_0070aef1;
  }
  UVar15 = (uint)(local_4be0.NumBonds != 0) << 2;
LAB_0070aef1:
  local_4b48 = uVar21;
  if (UVar15 == 0) {
    if (local_4be0.NumCoders != 0) {
      local_4b50 = outBuffer + outSize;
      uVar21 = 0;
      local_4c88 = (_func_UInt32_void_ptr_UInt32 *)0x0;
      local_4c78 = (CPpmd7_Context *)0x0;
      do {
        psVar1 = &local_4be0.Coders[uVar21].PropsOffset;
        UVar8 = local_4be0.Coders[uVar21].MethodID;
        if ((int)UVar8 < 0x30101) {
          if ((UVar8 == 0) || (UVar8 == 0x21)) goto LAB_0070af7e;
LAB_0070b09f:
          if (uVar21 == 1) {
            BVar2 = local_4be0.Coders[1].PropsSize;
            if (UVar8 == 3) {
              if (BVar2 == '\x01') {
                Delta_Init(local_4b28);
                Delta_Decode(local_4b28,local_4c98[*psVar1] + 1,outBuffer,outSize);
                goto LAB_0070b711;
              }
              goto LAB_0070b430;
            }
            if (BVar2 != '\0') goto LAB_0070b430;
            bVar20 = false;
            if (0x3030500 < (int)UVar8) {
              if (UVar8 == 0x3030501) {
                ARM_Convert(outBuffer,outSize,0,0);
                goto LAB_0070b711;
              }
              if (UVar8 == 0x3030701) {
                ARMT_Convert(outBuffer,outSize,0,0);
                goto LAB_0070b711;
              }
              if (UVar8 == 0x3030805) {
                SPARC_Convert(outBuffer,outSize,0,0);
                goto LAB_0070b711;
              }
LAB_0070b866:
              UVar15 = 4;
              goto LAB_0070b717;
            }
            if (UVar8 == 0x3030103) {
              local_4b28._0_8_ = local_4b28._0_8_ & 0xffffffff00000000;
              x86_Convert(outBuffer,outSize,0,(UInt32 *)local_4b28,0);
            }
            else if (UVar8 == 0x3030205) {
              PPC_Convert(outBuffer,outSize,0,0);
            }
            else {
              if (UVar8 != 0x3030401) goto LAB_0070b866;
              IA64_Convert(outBuffer,outSize,0,0);
            }
            goto LAB_0070b711;
          }
LAB_0070b430:
          bVar20 = false;
          UVar15 = 4;
        }
        else {
          if (UVar8 == 0x30101) {
LAB_0070af7e:
            uVar16 = 0;
            outBuffer_00 = (CPpmd7_Context *)outBuffer;
            UVar8 = UVar15;
            local_4cb8 = (_func_UInt32_void_ptr_UInt32 *)outSize;
            if ((int)uVar12 == 4) {
              local_4cb8 = (_func_UInt32_void_ptr_UInt32 *)local_4b40[uVar21];
              uVar16 = (ulong)*(uint *)(&DAT_00779390 + uVar21 * 4);
              if (uVar21 < 2) {
                outBuffer_00 = (CPpmd7_Context *)(*allocMain->Alloc)(allocMain,(size_t)local_4cb8);
                bVar20 = local_4cb8 == (_func_UInt32_void_ptr_UInt32 *)0x0 ||
                         outBuffer_00 != (CPpmd7_Context *)0x0;
                if (local_4cb8 == (_func_UInt32_void_ptr_UInt32 *)0x0 ||
                    outBuffer_00 != (CPpmd7_Context *)0x0) {
                  uVar14 = (1 - (int)uVar21) * 8;
                  *(CPpmd7_Context **)(local_4bf8 + uVar14) = outBuffer_00;
                  *(_func_UInt32_void_ptr_UInt32 **)(local_4b68 + uVar14) = local_4cb8;
                  bVar20 = true;
                }
                else {
                  UVar15 = 2;
                  outBuffer_00 = (CPpmd7_Context *)outBuffer;
                }
              }
              else {
                if (uVar21 == 2) {
                  if (local_4cb8 <= outSize) {
                    outBuffer_00 = (CPpmd7_Context *)(outBuffer + (outSize - (long)local_4cb8));
                    bVar20 = true;
                    local_4c88 = local_4cb8;
                    local_4c78 = outBuffer_00;
                    goto LAB_0070b196;
                  }
                  UVar15 = 5;
                }
                else {
                  UVar15 = 4;
                }
                bVar20 = false;
                local_4cb8 = (_func_UInt32_void_ptr_UInt32 *)outSize;
              }
LAB_0070b196:
              UVar8 = UVar15;
              if (!bVar20) goto LAB_0070b70b;
            }
            UVar11 = local_4c70[uVar16];
            UVar5 = local_4c70[(int)uVar16 + 1];
            UVar15 = LookInStream_SeekTo(local_4c90,local_4c68 + UVar11);
            pIVar6 = local_4c90;
            if (UVar15 == 0) {
              inSize_00 = (_func_UInt32_void_ptr_UInt32 *)(UVar5 - UVar11);
              UVar15 = local_4be0.Coders[uVar21].MethodID;
              bVar20 = false;
              if ((int)UVar15 < 0x30101) {
                if (UVar15 == 0) {
                  if (inSize_00 == local_4cb8) {
                    UVar15 = SzDecodeCopy((UInt64)inSize_00,local_4c90,(Byte *)outBuffer_00);
                    if (UVar15 == 0) goto LAB_0070ba10;
                    bVar20 = false;
                  }
                  else {
                    UVar15 = 1;
LAB_0070b70b:
                    bVar20 = false;
                  }
                }
                else {
                  if (UVar15 == 0x21) {
                    local_4b18 = (undefined1  [16])0x0;
                    UVar15 = 1;
                    if ((local_4be0.Coders[uVar21].PropsSize == '\x01') &&
                       (local_4c9c = UVar8,
                       UVar15 = Lzma2Dec_AllocateProbs
                                          ((CLzma2Dec *)local_4b28,local_4c98[*psVar1],allocMain),
                       UVar8 = local_4c9c, UVar15 == 0)) {
                      local_4b18._8_8_ = outBuffer_00;
                      local_4af0 = local_4cb8;
                      Lzma2Dec_Init((CLzma2Dec *)local_4b28);
                      do {
                        local_4c58.Read = (_func_Byte_void_ptr *)0x0;
                        local_4c20.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
                        if (inSize_00 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
                          local_4c20.p.GetThreshold = inSize_00;
                        }
                        UVar15 = (*pIVar6->Look)(pIVar6,&local_4c58.Read,(size_t *)&local_4c20);
                        p_Var18 = local_4af8;
                        if (UVar15 == 0) {
                          local_4ca8 = local_4c20.p.GetThreshold;
                          UVar15 = Lzma2Dec_DecodeToDic
                                             ((CLzma2Dec *)local_4b28,(SizeT)local_4cb8,
                                              (Byte *)local_4c58.Read,(SizeT *)&local_4ca8,
                                              LZMA_FINISH_END,&local_4cac);
                          local_4c20.p.GetThreshold = local_4c20.p.GetThreshold + -(long)local_4ca8;
                          inSize_00 = inSize_00 + -(long)local_4ca8;
                          if (UVar15 != 0) goto LAB_0070b32c;
                          if (local_4cac == LZMA_STATUS_FINISHED_WITH_MARK) {
                            UVar15 = (UInt32)(local_4af8 != local_4cb8 ||
                                             inSize_00 != (_func_UInt32_void_ptr_UInt32 *)0x0);
                            goto LAB_0070b32c;
                          }
                          if ((local_4ca8 == (_func_UInt32_void_ptr_UInt32 *)0x0) &&
                             (p_Var18 == local_4af8)) {
                            bVar20 = false;
                            UVar15 = 1;
                          }
                          else {
                            UVar15 = (*pIVar6->Skip)(pIVar6,(size_t)local_4ca8);
                            bVar20 = UVar15 == 0;
                          }
                        }
                        else {
LAB_0070b32c:
                          bVar20 = false;
                        }
                      } while (bVar20);
                      LzmaDec_FreeProbs((CLzmaDec *)local_4b28,allocMain);
                      UVar8 = local_4c9c;
                    }
                    if (UVar15 != 0) goto LAB_0070b70b;
                    goto LAB_0070ba10;
                  }
                  UVar15 = 4;
                }
              }
              else {
                if (UVar15 == 0x30101) {
                  local_4b18 = (undefined1  [16])0x0;
                  size = LzmaDec_AllocateProbs
                                   ((CLzmaDec *)local_4b28,local_4c98 + *psVar1,
                                    (uint)local_4be0.Coders[uVar21].PropsSize,allocMain);
                  if (size == 0) {
                    local_4b18._8_8_ = outBuffer_00;
                    local_4af0 = local_4cb8;
                    LzmaDec_Init((CLzmaDec *)local_4b28);
                    do {
                      local_4c58.Read = (_func_Byte_void_ptr *)0x0;
                      local_4c20.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
                      if (inSize_00 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
                        local_4c20.p.GetThreshold = inSize_00;
                      }
                      size = (*pIVar6->Look)(pIVar6,&local_4c58.Read,(size_t *)&local_4c20);
                      p_Var18 = local_4af8;
                      if (size == 0) {
                        local_4ca8 = local_4c20.p.GetThreshold;
                        size = LzmaDec_DecodeToDic((CLzmaDec *)local_4b28,(SizeT)local_4cb8,
                                                   (Byte *)local_4c58.Read,(SizeT *)&local_4ca8,
                                                   LZMA_FINISH_END,&local_4cac);
                        local_4c20.p.GetThreshold = local_4c20.p.GetThreshold + -(long)local_4ca8;
                        inSize_00 = inSize_00 + -(long)local_4ca8;
                        if (size != 0) goto LAB_0070b563;
                        if (local_4cac == LZMA_STATUS_FINISHED_WITH_MARK) {
                          size = (UInt32)(local_4af8 != local_4cb8 ||
                                         inSize_00 != (_func_UInt32_void_ptr_UInt32 *)0x0);
                          goto LAB_0070b563;
                        }
                        if ((local_4cac == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) &&
                           (local_4af8 == local_4cb8)) {
                          size = 0;
                          bVar20 = false;
                          if (inSize_00 != (_func_UInt32_void_ptr_UInt32 *)0x0) goto LAB_0070b5aa;
                        }
                        else {
LAB_0070b5aa:
                          if ((local_4ca8 == (_func_UInt32_void_ptr_UInt32 *)0x0) &&
                             (p_Var18 == local_4af8)) {
                            bVar20 = false;
                            size = 1;
                          }
                          else {
                            size = (*pIVar6->Skip)(pIVar6,(size_t)local_4ca8);
                            bVar20 = size == 0;
                          }
                        }
                      }
                      else {
LAB_0070b563:
                        bVar20 = false;
                      }
                    } while (bVar20);
                    LzmaDec_FreeProbs((CLzmaDec *)local_4b28,allocMain);
                  }
                }
                else {
                  if (UVar15 != 0x30401) {
                    UVar15 = 4;
                    goto LAB_0070b70d;
                  }
                  local_4c58.Read = ReadByte;
                  local_4c28 = local_4c90;
                  local_4c40 = (undefined1  [16])0x0;
                  local_4c50 = (undefined1  [16])0x0;
                  local_4c30 = 0;
                  size = 4;
                  if (local_4be0.Coders[uVar21].PropsSize == '\x05') {
                    bVar3 = local_4c98[*psVar1];
                    size = *(UInt32 *)(local_4c98 + *psVar1 + 1);
                    if (size + 0x24 < 0x824 || (byte)(bVar3 + 0xbf) < 0xc1) {
                      size = 4;
                      bVar20 = false;
                    }
                    else {
                      Ppmd7_Construct((CPpmd7 *)local_4b28);
                      BVar9 = Ppmd7_Alloc((CPpmd7 *)local_4b28,size,allocMain);
                      if (BVar9 == 0) {
                        size = 2;
                      }
                      else {
                        Ppmd7_Init((CPpmd7 *)local_4b28,(uint)bVar3);
                      }
                      bVar20 = BVar9 != 0;
                    }
                    if (bVar20) {
                      Ppmd7z_RangeDec_CreateVTable(&local_4c20);
                      local_4c20.Stream = &local_4c58;
                      BVar9 = Ppmd7z_RangeDec_Init(&local_4c20);
                      if (BVar9 == 0) {
                        size = 1;
                      }
                      else {
                        if ((int)local_4c30 == 0) {
                          p_Var17 = (_func_UInt32_void_ptr_UInt32 *)0x0;
                          p_Var18 = p_Var17;
                          if (local_4cb8 != (_func_UInt32_void_ptr_UInt32 *)0x0) {
                            do {
                              iVar10 = Ppmd7_DecodeSymbol((CPpmd7 *)local_4b28,&local_4c20.p);
                              p_Var18 = p_Var17;
                              if (((int)local_4c30 != 0) || (iVar10 < 0)) break;
                              *(Byte *)((long)&outBuffer_00->NumStats + (long)p_Var17) =
                                   (Byte)iVar10;
                              p_Var17 = p_Var17 + 1;
                              p_Var18 = local_4cb8;
                            } while (local_4cb8 != p_Var17);
                          }
                          if (p_Var18 == local_4cb8) {
                            size = (UInt32)(local_4c20.Code != 0 ||
                                           (_func_UInt32_void_ptr_UInt32 *)
                                           ((local_4c40._8_8_ + local_4c50._0_8_) - local_4c40._0_8_
                                           ) != inSize_00);
                            goto LAB_0070b9ea;
                          }
                        }
                        size = local_4c30._4_4_ + (uint)(local_4c30._4_4_ == 0);
                      }
LAB_0070b9ea:
                      Ppmd7_Free((CPpmd7 *)local_4b28,allocMain);
                    }
                  }
                }
                if (size != 0) goto LAB_0070ba04;
LAB_0070ba10:
                bVar20 = true;
                UVar15 = UVar8;
              }
            }
            else {
              bVar20 = false;
            }
          }
          else {
            if (UVar8 != 0x303011b) {
              if (UVar8 != 0x30401) goto LAB_0070b09f;
              goto LAB_0070af7e;
            }
            if (uVar21 != 3) {
              UVar15 = 4;
              goto LAB_0070b70b;
            }
            UVar11 = local_4c70[1];
            UVar5 = local_4c70[2];
            inSize = UVar5 - UVar11;
            local_4b58 = inSize;
            pBVar13 = (Byte *)(*allocMain->Alloc)(allocMain,inSize);
            pIVar6 = local_4c90;
            local_4be8 = pBVar13;
            if (pBVar13 == (Byte *)0x0 && UVar5 != UVar11) {
              bVar20 = false;
              UVar15 = 2;
              goto LAB_0070b70d;
            }
            size = LookInStream_SeekTo(local_4c90,UVar11 + local_4c68);
            if (size == 0) {
              UVar8 = SzDecodeCopy(inSize,pIVar6,pBVar13);
              if (UVar8 == 0) {
                if ((local_4b68 & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
                  if (((local_4b68 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
                     (local_4c88 + local_4b68._8_8_ + local_4b68._0_8_ ==
                      (_func_UInt32_void_ptr_UInt32 *)outSize)) {
                    local_4b28._0_8_ = local_4c78;
                    local_4b08 = local_4c88 + (long)local_4c78;
                    local_4b28._8_8_ = local_4bf8._0_8_;
                    local_4b00 = (Byte *)((long)(UInt16 *)local_4bf8._0_8_ + local_4b68._0_8_);
                    local_4af8 = (_func_UInt32_void_ptr_UInt32 *)
                                 (local_4b68._8_8_ + local_4bf8._8_8_);
                    local_4b18._8_8_ = pBVar13;
                    local_4b18._0_8_ = local_4bf8._8_8_;
                    local_4af0 = (_func_UInt32_void_ptr_UInt32 *)(pBVar13 + inSize);
                    local_4ae8[1] = local_4b50;
                    local_4ae8[0] = outBuffer;
                    Bcj2Dec_Init((CBcj2Dec *)local_4b28);
                    UVar8 = Bcj2Dec_Decode((CBcj2Dec *)local_4b28);
                    if (UVar8 == 0) {
                      lVar19 = -0x20;
                      do {
                        if (*(long *)((long)&local_4b08 + lVar19) !=
                            *(long *)((long)local_4ae8 + lVar19)) goto LAB_0070ba40;
                        lVar19 = lVar19 + 8;
                      } while (lVar19 != 0);
                      if (local_4ac8 == 0) {
                        bVar20 = local_4ad8 == 0 && local_4ae8[0] == local_4ae8[1];
                        if (local_4ad8 != 0 || local_4ae8[0] != local_4ae8[1]) {
                          UVar15 = 1;
                        }
                      }
                      else {
LAB_0070ba40:
                        bVar20 = false;
                        UVar15 = 1;
                      }
                    }
                    else {
                      bVar20 = false;
                      UVar15 = UVar8;
                    }
                  }
                  else {
                    bVar20 = false;
                    UVar15 = 1;
                  }
                }
                else {
                  bVar20 = false;
                  UVar15 = 1;
                }
              }
              else {
                bVar20 = false;
                UVar15 = UVar8;
              }
              goto LAB_0070b70d;
            }
LAB_0070ba04:
            bVar20 = false;
            UVar15 = size;
          }
LAB_0070b70d:
          if (bVar20) {
LAB_0070b711:
            bVar20 = true;
          }
          else {
            bVar20 = false;
          }
        }
LAB_0070b717:
        if (!bVar20) goto LAB_0070ba7f;
        uVar21 = uVar21 + 1;
        uVar12 = (ulong)local_4be0.NumCoders;
      } while (uVar21 < uVar12);
    }
    UVar15 = 0;
  }
LAB_0070ba7f:
  uVar21 = local_4c60;
  lVar19 = 0;
  do {
    (*allocMain->Free)(allocMain,*(void **)(local_4bf8 + lVar19 * 8));
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  if (UVar15 == 0) {
    pBVar13 = (local_4c80->FolderCRCs).Defs;
    UVar15 = 0;
    if ((pBVar13 != (Byte *)0x0) &&
       ((char)(pBVar13[uVar21 >> 3 & 0x1fffffff] << ((byte)uVar21 & 7)) < '\0')) {
      UVar15 = CrcCalc(outBuffer,outSize);
      UVar15 = (uint)(UVar15 != (local_4c80->FolderCRCs).Vals[local_4b48]) * 3;
    }
  }
  return UVar15;
}

Assistant:

SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}